

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O0

ImDrawCmd * __thiscall
ImVector<ImDrawCmd>::insert(ImVector<ImDrawCmd> *this,ImDrawCmd *it,ImDrawCmd *v)

{
  bool bVar1;
  int new_capacity;
  long lVar2;
  ptrdiff_t off;
  ImDrawCmd *v_local;
  ImDrawCmd *it_local;
  ImVector<ImDrawCmd> *this_local;
  
  bVar1 = false;
  if (this->Data <= it) {
    bVar1 = it <= this->Data + this->Size;
  }
  if (!bVar1) {
    __assert_fail("it >= Data && it <= Data+Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/./imgui/imgui.h"
                  ,0x4f2,"T *ImVector<ImDrawCmd>::insert(const T *, const T &) [T = ImDrawCmd]");
  }
  lVar2 = ((long)it - (long)this->Data) / 0x38;
  if (this->Size == this->Capacity) {
    new_capacity = _grow_capacity(this,this->Size + 1);
    reserve(this,new_capacity);
  }
  if (lVar2 < this->Size) {
    memmove(this->Data + lVar2 + 1,this->Data + lVar2,(this->Size - lVar2) * 0x38);
  }
  memcpy(this->Data + lVar2,v,0x38);
  this->Size = this->Size + 1;
  return this->Data + lVar2;
}

Assistant:

inline T*           insert(const T* it, const T& v)     { IM_ASSERT(it >= Data && it <= Data+Size); const ptrdiff_t off = it - Data; if (Size == Capacity) reserve(_grow_capacity(Size + 1)); if (off < (int)Size) memmove(Data + off + 1, Data + off, ((size_t)Size - (size_t)off) * sizeof(T)); memcpy(&Data[off], &v, sizeof(v)); Size++; return Data + off; }